

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

int Wln_RetPropDelay(Wln_Ret_t *p)

{
  int iVar1;
  int local_18;
  int Delay;
  int DelayMax;
  int iObj;
  Wln_Ret_t *p_local;
  
  local_18 = 0;
  Vec_IntClear(&p->vSinks);
  for (Delay = 1; iVar1 = Wln_NtkObjNum(p->pNtk), Delay < iVar1; Delay = Delay + 1) {
    iVar1 = Wln_ObjIsCio(p->pNtk,Delay);
    if (iVar1 == 0) {
      iVar1 = Wln_RetPropDelay_rec(p,Delay);
      if (local_18 == iVar1) {
        Vec_IntPush(&p->vSinks,Delay);
      }
      else if (local_18 < iVar1) {
        Vec_IntFill(&p->vSinks,1,Delay);
        local_18 = iVar1;
      }
    }
  }
  return local_18;
}

Assistant:

int Wln_RetPropDelay( Wln_Ret_t * p )
{
    int iObj, DelayMax = 0;
    Vec_IntClear( &p->vSinks );
    Wln_NtkForEachObj( p->pNtk, iObj )
        if ( !Wln_ObjIsCio(p->pNtk, iObj) )
        {
            int Delay = Wln_RetPropDelay_rec(p, iObj);
            if ( DelayMax == Delay )
                Vec_IntPush( &p->vSinks, iObj );
            else if ( DelayMax < Delay )
            {
                DelayMax = Delay;
                Vec_IntFill( &p->vSinks, 1, iObj );
            }
        }

//    Vec_IntForEachEntry( &p->vPathDelays, iObj, i )
//        printf( "Obj = %d.  Delay = %d.\n", i, iObj );
//    printf( "\n" );

//    printf( "Sinks: " );
//    Vec_IntPrint( &p->vSinks );

    return DelayMax;
}